

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  undefined8 *puVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  long *plVar6;
  ostream *poVar7;
  size_t sVar8;
  undefined8 *puVar9;
  undefined8 extraout_RAX;
  long *plVar10;
  ulong *puVar11;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  size_type *psVar13;
  ulong uVar14;
  undefined8 uVar15;
  stringstream *ss;
  int iVar16;
  undefined1 local_228 [8];
  char buffer [256];
  undefined1 local_118 [16];
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  string local_e8;
  int local_c4;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90;
  long lStack_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  stringstream *local_60;
  string local_58;
  byte local_31 [8];
  char flag;
  
  do {
    sVar4 = read(this->read_fd_,local_31,1);
    iVar2 = (int)sVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        this->outcome_ = DIED;
        goto LAB_00133cd7;
      }
      if (iVar2 == 1) {
        if (local_31[0] < 0x52) {
          if (local_31[0] == 0x49) {
            iVar2 = this->read_fd_;
            Message::Message((Message *)&local_c0);
            local_60 = local_c0.ptr_;
            goto LAB_00133e2e;
          }
          if (local_31[0] == 0x4c) {
            this->outcome_ = LIVED;
            goto LAB_00133cd7;
          }
        }
        else {
          if (local_31[0] == 0x54) {
            this->outcome_ = THREW;
            goto LAB_00133cd7;
          }
          if (local_31[0] == 0x52) {
            this->outcome_ = RETURNED;
            goto LAB_00133cd7;
          }
        }
        GTestLog::GTestLog((GTestLog *)local_228,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                           ,0x1d1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Death test child process reported ",0x22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unexpected status byte (",0x18);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        GTestLog::~GTestLog((GTestLog *)local_228);
        goto LAB_00133cd7;
      }
      break;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  GTestLog::GTestLog((GTestLog *)&local_58,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1d6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,(char *)local_228,buffer._0_8_);
  if (local_228 != (undefined1  [8])(buffer + 8)) {
    operator_delete((void *)local_228,buffer._8_8_ + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_58);
  goto LAB_00133cd7;
  while( true ) {
    piVar5 = __errno_location();
    iVar16 = *piVar5;
    if (iVar16 != 4) break;
LAB_00133e2e:
    while( true ) {
      sVar4 = read(iVar2,local_228,0xff);
      ss = local_60;
      uVar3 = (uint)sVar4;
      if ((int)uVar3 < 1) break;
      buffer[(ulong)(uVar3 & 0x7fffffff) - 8] = '\0';
      sVar8 = strlen(local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_c0.ptr_ + 0x10),local_228,sVar8);
    }
    if (uVar3 != 0xffffffff) {
      if (uVar3 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                           ,0x150);
        StringStreamToString(&local_58,ss);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
        goto LAB_00133f60;
      }
      piVar5 = __errno_location();
      iVar16 = *piVar5;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_80,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/VBot2410[P]A_Star_3D/vendor/googletest/googletest/src/gtest-death-test.cc"
                     ,0x153);
  ss = local_60;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
  GetLastErrnoDescription_abi_cxx11_();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," [",2);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
LAB_00133f60:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_80);
  if (ss != (stringstream *)0x0) {
    (**(code **)(*(long *)ss + 8))(ss);
  }
LAB_00133cd7:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  buffer._248_8_ = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(buffer + 0xf8),"CHECK failed: File ","");
  plVar6 = (long *)std::__cxx11::string::append(buffer + 0xf8);
  local_108 = (long *)*plVar6;
  plVar10 = plVar6 + 2;
  if (local_108 == plVar10) {
    local_f8 = *plVar10;
    lStack_f0 = plVar6[3];
    local_108 = &local_f8;
  }
  else {
    local_f8 = *plVar10;
  }
  local_100 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_a0 = (ulong *)*plVar6;
  puVar11 = (ulong *)(plVar6 + 2);
  if (local_a0 == puVar11) {
    local_90 = *puVar11;
    lStack_88 = plVar6[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *puVar11;
  }
  local_98 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c4 = 0x1d9;
  StreamableToString<int>(&local_e8,&local_c4);
  uVar14 = 0xf;
  if (local_a0 != &local_90) {
    uVar14 = local_90;
  }
  if (uVar14 < local_e8._M_string_length + local_98) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      uVar15 = local_e8.field_2._M_allocated_capacity;
    }
    if (local_e8._M_string_length + local_98 <= (ulong)uVar15) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_a0);
      goto LAB_001340ac;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_e8._M_dataplus._M_p);
LAB_001340ac:
  local_80 = (undefined8 *)*puVar9;
  puVar1 = puVar9 + 2;
  if (local_80 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar9[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar1;
  }
  local_78 = puVar9[1];
  *puVar9 = puVar1;
  puVar9[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_c0.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6
  ;
  pbVar12 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
  if (local_c0.ptr_ == pbVar12) {
    local_b0 = *(long *)pbVar12;
    lStack_a8 = plVar6[3];
    local_c0.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
  }
  else {
    local_b0 = *(long *)pbVar12;
  }
  local_b8 = plVar6[1];
  *plVar6 = (long)pbVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_58._M_dataplus._M_p = (pointer)*plVar6;
  psVar13 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_58._M_dataplus._M_p == psVar13) {
    local_58.field_2._M_allocated_capacity = *psVar13;
    local_58.field_2._8_8_ = plVar6[3];
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = *psVar13;
  }
  local_58._M_string_length = plVar6[1];
  *plVar6 = (long)psVar13;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_58);
  local_228 = (undefined1  [8])*plVar6;
  plVar10 = plVar6 + 2;
  if (local_228 == (undefined1  [8])plVar10) {
    buffer._8_8_ = *plVar10;
    buffer._16_8_ = plVar6[3];
    local_228 = (undefined1  [8])(buffer + 8);
  }
  else {
    buffer._8_8_ = *plVar10;
  }
  buffer._0_8_ = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  DeathTestAbort((string *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_80);
  if (local_60 != (stringstream *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}